

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

_Bool hdr_record_values(hdr_histogram *h,int64_t value,int64_t count)

{
  long lVar1;
  int32_t iVar2;
  long lVar3;
  
  if (value < 0) {
    return false;
  }
  if (((value <= h->highest_trackable_value) && (iVar2 = counts_index_for(h,value), -1 < iVar2)) &&
     (iVar2 < h->counts_len)) {
    iVar2 = normalize_index(h,iVar2);
    h->counts[iVar2] = h->counts[iVar2] + count;
    h->total_count = h->total_count + count;
    lVar1 = h->min_value;
    lVar3 = value;
    if (lVar1 < value) {
      lVar3 = lVar1;
    }
    if (value == 0) {
      lVar3 = lVar1;
    }
    h->min_value = lVar3;
    if (value < h->max_value) {
      value = h->max_value;
    }
    h->max_value = value;
    return true;
  }
  return false;
}

Assistant:

bool hdr_record_values(struct hdr_histogram* h, int64_t value, int64_t count)
{
    int32_t counts_index;

    if (value < 0 || h->highest_trackable_value < value)
    {
        return false;
    }

    counts_index = counts_index_for(h, value);
    if (counts_index < 0 || h->counts_len <= counts_index)
    {
        return false;
    }

    counts_inc_normalised(h, counts_index, count);
    update_min_max(h, value);

    return true;
}